

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void srclistRenumberCursors(Parse *pParse,int *aCsrMap,SrcList *pSrc,int iExcept)

{
  int iVar1;
  Select *pSVar2;
  int iVar3;
  int iVar4;
  SrcItem *pSVar5;
  Select **ppSVar6;
  
  pSVar5 = pSrc->a;
  for (iVar4 = 0; iVar4 < pSrc->nSrc; iVar4 = iVar4 + 1) {
    if (iVar4 != iExcept) {
      iVar1 = pSVar5->iCursor;
      if ((((pSVar5->fg).field_0x1 & 0x40) == 0) || (iVar3 = aCsrMap[(long)iVar1 + 1], iVar3 == 0))
      {
        iVar3 = pParse->nTab;
        pParse->nTab = iVar3 + 1;
        aCsrMap[(long)iVar1 + 1] = iVar3;
        iVar3 = aCsrMap[(long)pSVar5->iCursor + 1];
      }
      pSVar5->iCursor = iVar3;
      ppSVar6 = &pSVar5->pSelect;
      while (pSVar2 = *ppSVar6, pSVar2 != (Select *)0x0) {
        srclistRenumberCursors(pParse,aCsrMap,pSVar2->pSrc,-1);
        ppSVar6 = &pSVar2->pPrior;
      }
    }
    pSVar5 = pSVar5 + 1;
  }
  return;
}

Assistant:

static void srclistRenumberCursors(
  Parse *pParse,                  /* Parse context */
  int *aCsrMap,                   /* Array to store cursor mappings in */
  SrcList *pSrc,                  /* FROM clause to renumber */
  int iExcept                     /* FROM clause item to skip */
){
  int i;
  SrcItem *pItem;
  for(i=0, pItem=pSrc->a; i<pSrc->nSrc; i++, pItem++){
    if( i!=iExcept ){
      Select *p;
      assert( pItem->iCursor < aCsrMap[0] );
      if( !pItem->fg.isRecursive || aCsrMap[pItem->iCursor+1]==0 ){
        aCsrMap[pItem->iCursor+1] = pParse->nTab++;
      }
      pItem->iCursor = aCsrMap[pItem->iCursor+1];
      for(p=pItem->pSelect; p; p=p->pPrior){
        srclistRenumberCursors(pParse, aCsrMap, p->pSrc, -1);
      }
    }
  }
}